

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantsTests.cpp
# Opt level: O0

void __thiscall ConstantsTest_Values_Test<double>::TestBody(ConstantsTest_Values_Test<double> *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult *pAVar3;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertHelper *in_stack_fffffffffffffdf0;
  double *in_stack_fffffffffffffdf8;
  char *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  int line;
  char *in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  Type type;
  AssertHelper *in_stack_fffffffffffffe20;
  Message *in_stack_fffffffffffffe48;
  Message *message;
  AssertHelper *in_stack_fffffffffffffe50;
  AssertionResult local_180 [2];
  double local_160;
  undefined8 local_158;
  AssertionResult local_150 [2];
  double local_130;
  undefined8 local_128;
  AssertionResult local_120 [2];
  double local_100;
  undefined8 local_f8;
  AssertionResult local_f0 [2];
  double local_d0;
  undefined8 local_c8;
  AssertionResult local_c0 [2];
  double local_a0;
  undefined8 local_98;
  AssertionResult local_90 [2];
  undefined8 local_68;
  AssertionResult local_60;
  uint local_4c;
  char local_30 [8];
  double local_28;
  undefined8 local_20;
  AssertionResult local_18;
  
  type = (Type)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  local_20 = 0x400921fb5443d6f4;
  local_28 = pica::Constants<double>::pi();
  pcVar2 = "static_cast<TypeParam>(constants::pi)";
  testing::internal::EqHelper<false>::Compare<double,double>
            (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             (double *)in_stack_fffffffffffffdf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe20);
    testing::AssertionResult::failure_message((AssertionResult *)0x1d40dd);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe20,type,in_stack_fffffffffffffe10,
               (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),in_stack_fffffffffffffe00);
    pcVar2 = local_30;
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffdf0);
    testing::Message::~Message((Message *)0x1d413a);
  }
  local_4c = (uint)!bVar1;
  pAVar3 = &local_18;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d41c1);
  if (local_4c == 0) {
    local_68 = 0x421beb9bf3a00000;
    pica::Constants<double>::c(pAVar3,pcVar2);
    testing::internal::EqHelper<false>::Compare<double,double>
              (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
               (double *)in_stack_fffffffffffffdf0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe20);
      in_stack_fffffffffffffe20 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x1d4263);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe20,type,in_stack_fffffffffffffe10,
                 (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),in_stack_fffffffffffffe00);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffdf0);
      testing::Message::~Message((Message *)0x1d42c0);
    }
    local_4c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d4347);
    if (local_4c == 0) {
      local_98 = 0x421beb9bf3a00000;
      local_a0 = pica::Constants<double>::lightVelocity();
      testing::internal::EqHelper<false>::Compare<double,double>
                (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                 (double *)in_stack_fffffffffffffdf0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_90);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe20);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1d43e9);
        type = (Type)((ulong)pcVar2 >> 0x20);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe20,type,in_stack_fffffffffffffe10,
                   (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),in_stack_fffffffffffffe00);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffdf0);
        testing::Message::~Message((Message *)0x1d4446);
      }
      local_4c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d44cd);
      if (local_4c == 0) {
        local_c8 = 0xbe0080f172b1f37d;
        local_d0 = pica::Constants<double>::electronCharge();
        testing::internal::EqHelper<false>::Compare<double,double>
                  (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                   (double *)in_stack_fffffffffffffdf0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c0);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe20);
          in_stack_fffffffffffffe10 =
               testing::AssertionResult::failure_message((AssertionResult *)0x1d456f);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffe20,type,in_stack_fffffffffffffe10,
                     (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),in_stack_fffffffffffffe00);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffdf0);
          testing::Message::~Message((Message *)0x1d45cc);
        }
        local_4c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d4653);
        if (local_4c == 0) {
          local_f8 = 0x3a520b016873bbd3;
          local_100 = pica::Constants<double>::electronMass();
          testing::internal::EqHelper<false>::Compare<double,double>
                    (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                     (double *)in_stack_fffffffffffffdf0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_f0);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffe20);
            in_stack_fffffffffffffe08 =
                 testing::AssertionResult::failure_message((AssertionResult *)0x1d46f5);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffe20,type,in_stack_fffffffffffffe10,
                       (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),in_stack_fffffffffffffe00);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
            testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffdf0);
            testing::Message::~Message((Message *)0x1d4752);
          }
          local_4c = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d47d9);
          if (local_4c == 0) {
            local_128 = 0x3b002d36c08bec5d;
            local_130 = pica::Constants<double>::protonMass();
            testing::internal::EqHelper<false>::Compare<double,double>
                      (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8
                       ,(double *)in_stack_fffffffffffffdf0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_120);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffffe20);
              in_stack_fffffffffffffe00 =
                   testing::AssertionResult::failure_message((AssertionResult *)0x1d487b);
              testing::internal::AssertHelper::AssertHelper
                        (in_stack_fffffffffffffe20,type,in_stack_fffffffffffffe10,
                         (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),in_stack_fffffffffffffe00);
              testing::internal::AssertHelper::operator=
                        (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
              testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffdf0);
              testing::Message::~Message((Message *)0x1d48d8);
            }
            local_4c = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d495f);
            if (local_4c == 0) {
              local_158 = 0x3a54e3504ec0acb9;
              local_160 = pica::Constants<double>::planck();
              testing::internal::EqHelper<false>::Compare<double,double>
                        (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                         in_stack_fffffffffffffdf8,(double *)in_stack_fffffffffffffdf0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(local_150);
              if (!bVar1) {
                testing::Message::Message((Message *)in_stack_fffffffffffffe20);
                in_stack_fffffffffffffdf8 =
                     (double *)
                     testing::AssertionResult::failure_message((AssertionResult *)0x1d4a01);
                testing::internal::AssertHelper::AssertHelper
                          (in_stack_fffffffffffffe20,type,in_stack_fffffffffffffe10,
                           (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),in_stack_fffffffffffffe00
                          );
                testing::internal::AssertHelper::operator=
                          (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
                testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffdf0);
                testing::Message::~Message((Message *)0x1d4a5e);
              }
              local_4c = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d4ae5);
              if (local_4c == 0) {
                pica::Constants<double>::eV();
                testing::internal::EqHelper<false>::Compare<double,double>
                          (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                           in_stack_fffffffffffffdf8,(double *)in_stack_fffffffffffffdf0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool(local_180);
                if (!bVar1) {
                  testing::Message::Message((Message *)in_stack_fffffffffffffe20);
                  in_stack_fffffffffffffdf0 =
                       (AssertHelper *)
                       testing::AssertionResult::failure_message((AssertionResult *)0x1d4b87);
                  testing::internal::AssertHelper::AssertHelper
                            (in_stack_fffffffffffffe20,type,in_stack_fffffffffffffe10,
                             (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                             in_stack_fffffffffffffe00);
                  testing::internal::AssertHelper::operator=
                            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
                  testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffdf0);
                  testing::Message::~Message((Message *)0x1d4bdb);
                }
                local_4c = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d4c5c);
                if (local_4c == 0) {
                  message = (Message *)0x3ebae14bc36b1270;
                  pica::Constants<double>::meV();
                  testing::internal::EqHelper<false>::Compare<double,double>
                            (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                             in_stack_fffffffffffffdf8,(double *)in_stack_fffffffffffffdf0);
                  line = (int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)&stack0xfffffffffffffe50);
                  if (!bVar1) {
                    testing::Message::Message((Message *)in_stack_fffffffffffffe20);
                    testing::AssertionResult::failure_message((AssertionResult *)0x1d4ce6);
                    testing::internal::AssertHelper::AssertHelper
                              (in_stack_fffffffffffffe20,type,in_stack_fffffffffffffe10,line,
                               in_stack_fffffffffffffe00);
                    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe50,message);
                    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffdf0);
                    testing::Message::~Message((Message *)0x1d4d32);
                  }
                  local_4c = (uint)!bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d4daa);
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TYPED_TEST(ConstantsTest, Values)
{
    // Check that all members of Constants<T> can be instantiated for all T in types
    // and are the same as casted corresponding values of constants namespace
    ASSERT_EQ(static_cast<TypeParam>(constants::pi), Constants<TypeParam>::pi());
    ASSERT_EQ(static_cast<TypeParam>(constants::c), Constants<TypeParam>::c());
    ASSERT_EQ(static_cast<TypeParam>(constants::lightVelocity), Constants<TypeParam>::lightVelocity());
    ASSERT_EQ(static_cast<TypeParam>(constants::electronCharge), Constants<TypeParam>::electronCharge());
    ASSERT_EQ(static_cast<TypeParam>(constants::electronMass), Constants<TypeParam>::electronMass());
    ASSERT_EQ(static_cast<TypeParam>(constants::protonMass), Constants<TypeParam>::protonMass());
    ASSERT_EQ(static_cast<TypeParam>(constants::planck), Constants<TypeParam>::planck());
    ASSERT_EQ(static_cast<TypeParam>(constants::eV), Constants<TypeParam>::eV());
    ASSERT_EQ(static_cast<TypeParam>(constants::meV), Constants<TypeParam>::meV());
}